

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YamahaCommands.hpp
# Opt level: O0

void __thiscall
TI::TMS::Commands::Rectangle<false,_false>::Rectangle
          (Rectangle<false,_false> *this,CommandContext *context,ModeDescription *mode_description)

{
  int *local_28;
  ModeDescription *mode_description_local;
  CommandContext *context_local;
  Rectangle<false,_false> *this_local;
  
  Command::Command(&this->super_Command,context,mode_description);
  (this->super_Command)._vptr_Command = (_func_int **)&PTR__Rectangle_00c975b8;
  local_28 = this->start_x_;
  do {
    *local_28 = 0;
    local_28 = local_28 + 1;
  } while (local_28 != &this->width_);
  this->width_ = 0;
  this->start_x_[1] = (context->destination).v[0];
  this->width_ = (context->size).v[0];
  return;
}

Assistant:

Rectangle(CommandContext &context, ModeDescription &mode_description) : Command(context, mode_description) {
			if constexpr (include_source) {
				start_x_[0] = context.source.v[0];
			}
			start_x_[1] = context.destination.v[0];
			width_ = context.size.v[0];

			if(!width_) {
				// Width = 0 => maximal width for this mode.
				// (aside: it's still unclear to me whether commands are
				// automatically clipped to the display; I think so but
				// don't want to spend any time on it until I'm certain)
//				context.size.v[0] = width_ = mode_description.width;
			}
		}